

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

cio_error cio_timer_cancel(cio_timer *timer)

{
  int iVar1;
  int *piVar2;
  cio_error cVar3;
  itimerspec timeout;
  itimerspec local_38;
  
  if (timer->handler == (cio_timer_handler_t)0x0) {
    cVar3 = CIO_OPERATION_NOT_PERMITTED;
  }
  else {
    local_38.it_value.tv_sec = 0;
    local_38.it_value.tv_nsec = 0;
    local_38.it_interval.tv_sec = 0;
    local_38.it_interval.tv_nsec = 0;
    cVar3 = CIO_SUCCESS;
    iVar1 = timerfd_settime((timer->impl).ev.fd,0,&local_38,(itimerspec *)0x0);
    if (iVar1 == 0) {
      (*timer->handler)(timer,timer->handler_context,CIO_OPERATION_ABORTED);
      timer->handler = (cio_timer_handler_t)0x0;
    }
    else {
      piVar2 = __errno_location();
      cVar3 = -*piVar2;
    }
  }
  return cVar3;
}

Assistant:

enum cio_error cio_timer_cancel(struct cio_timer *timer)
{
	struct itimerspec timeout;

	if (timer->handler == NULL) {
		return CIO_OPERATION_NOT_PERMITTED;
	}

	memset(&timeout, 0x0, sizeof(timeout));
	int ret = timerfd_settime(timer->impl.ev.fd, 0, &timeout, NULL);
	if (cio_likely(ret == 0)) {
		timer->handler(timer, timer->handler_context, CIO_OPERATION_ABORTED);
		timer->handler = NULL;
		return CIO_SUCCESS;
	}

	return (enum cio_error)(-errno);
}